

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stun_msg.c
# Opt level: O3

void stun_attr_varsize_add
               (stun_msg_hdr *msg_hdr,uint16_t type,void *buf,size_t buf_size,uint8_t pad)

{
  uint8_t *begin;
  ulong uVar1;
  ushort uVar2;
  
  uVar1 = (ulong)(ushort)(msg_hdr->length << 8 | msg_hdr->length >> 8);
  *(uint16_t *)(msg_hdr[1].tsx_id + (uVar1 - 8)) = type << 8 | type >> 8;
  uVar2 = (ushort)buf_size << 8 | (ushort)buf_size >> 8;
  *(ushort *)(msg_hdr[1].tsx_id + (uVar1 - 6)) = uVar2;
  memcpy(msg_hdr[1].tsx_id + (uVar1 - 4),buf,buf_size);
  if ((buf_size & 3) != 0) {
    memset(msg_hdr[1].tsx_id + (uVar1 - 4) + buf_size,(uint)pad,4 - (buf_size & 3));
    uVar2 = *(ushort *)(msg_hdr[1].tsx_id + (uVar1 - 6));
  }
  uVar2 = (msg_hdr->length << 8 | msg_hdr->length >> 8) + ((uVar2 << 8 | uVar2 >> 8) + 3 & 0xfffc) +
          4;
  msg_hdr->length = uVar2 * 0x100 | uVar2 >> 8;
  return;
}

Assistant:

void stun_attr_varsize_add(stun_msg_hdr *msg_hdr, uint16_t type,
                           const void *buf, size_t buf_size, uint8_t pad) {
  stun_attr_varsize *attr =
      (stun_attr_varsize *)stun_msg_end(msg_hdr);
  stun_attr_varsize_init(attr, type, buf, buf_size, pad);
  stun_msg_add_attr(msg_hdr, &attr->hdr);
}